

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlSaveFormatFileTo(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding,int format)

{
  undefined1 local_c8 [4];
  int ret;
  xmlSaveCtxt ctxt;
  int format_local;
  char *encoding_local;
  xmlDocPtr cur_local;
  xmlOutputBufferPtr buf_local;
  
  if (buf == (xmlOutputBufferPtr)0x0) {
    buf_local._4_4_ = -1;
  }
  else {
    ctxt.escapeAttr._4_4_ = format;
    if ((cur == (xmlDocPtr)0x0) ||
       ((cur->type != XML_DOCUMENT_NODE && (cur->type != XML_HTML_DOCUMENT_NODE)))) {
      xmlOutputBufferClose(buf);
      buf_local._4_4_ = -1;
    }
    else {
      memset(local_c8,0,0x98);
      ctxt.buf._4_4_ = 0;
      ctxt.options = (int)(ctxt.escapeAttr._4_4_ != 0);
      ctxt.filename = (xmlChar *)encoding;
      ctxt.handler = (xmlCharEncodingHandlerPtr)buf;
      xmlSaveCtxtInit((xmlSaveCtxtPtr)local_c8);
      ctxt.buf._0_4_ = (uint)ctxt.buf | 0x20;
      xmlDocContentDumpOutput((xmlSaveCtxtPtr)local_c8,cur);
      buf_local._4_4_ = xmlOutputBufferClose(buf);
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlSaveFormatFileTo(xmlOutputBufferPtr buf, xmlDocPtr cur,
                    const char *encoding, int format)
{
    xmlSaveCtxt ctxt;
    int ret;

    if (buf == NULL) return(-1);
    if ((cur == NULL) ||
        ((cur->type != XML_DOCUMENT_NODE) &&
	 (cur->type != XML_HTML_DOCUMENT_NODE))) {
        xmlOutputBufferClose(buf);
	return(-1);
    }
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.format = format ? 1 : 0;
    ctxt.encoding = (const xmlChar *) encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, cur);
    ret = xmlOutputBufferClose(buf);
    return (ret);
}